

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall
chrono::ChAssembly::ConstraintsBiLoad_C
          (ChAssembly *this,double factor,double recovery_clamp,bool do_clamp)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  pointer psVar9;
  element_type *peVar10;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar11;
  pointer psVar12;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  
  psVar11 = (this->bodylist).
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar1) {
    do {
      peVar2 = (psVar11->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
                (factor,recovery_clamp,peVar2,(ulong)do_clamp);
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  psVar12 = (this->shaftlist).
            super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 != psVar3) {
    do {
      peVar4 = (psVar12->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
                (factor,recovery_clamp,peVar4,(ulong)do_clamp);
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar3);
  }
  psVar13 = (this->linklist).
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar13 != psVar5) {
    do {
      peVar6 = (psVar13->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar6->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x33])
                (factor,recovery_clamp,peVar6,(ulong)do_clamp);
      psVar13 = psVar13 + 1;
    } while (psVar13 != psVar5);
  }
  psVar14 = (this->meshlist).
            super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar7) {
    do {
      peVar8 = (psVar14->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      (*(peVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x33])
                (factor,recovery_clamp,peVar8,(ulong)do_clamp);
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar7);
  }
  psVar15 = (this->otherphysicslist).
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar15 != psVar9) {
    do {
      peVar10 = (psVar15->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      (*(peVar10->super_ChObj)._vptr_ChObj[0x33])(factor,recovery_clamp,peVar10,(ulong)do_clamp);
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar9);
  }
  return;
}

Assistant:

void ChAssembly::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    for (auto& body : bodylist) {
        body->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    }
    for (auto& shaft : shaftlist) {
        shaft->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    }
    for (auto& link : linklist) {
        link->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    }
    for (auto& mesh : meshlist) {
        mesh->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    }
    for (auto& item : otherphysicslist) {
        item->ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);
    }
}